

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextobject.cpp
# Opt level: O2

QTextLayout * __thiscall QTextBlock::layout(QTextBlock *this)

{
  QTextBlockData *pQVar1;
  QTextLayout *this_00;
  ulong uVar2;
  
  if ((this->p == (QTextDocumentPrivate *)0x0) || (uVar2 = (ulong)(uint)this->n, uVar2 == 0)) {
    this_00 = (QTextLayout *)0x0;
  }
  else {
    pQVar1 = (this->p->blocks).data.field_0.fragments;
    this_00 = pQVar1[uVar2].layout;
    if (this_00 == (QTextLayout *)0x0) {
      this_00 = (QTextLayout *)operator_new(8);
      QTextLayout::QTextLayout(this_00,this);
      pQVar1[uVar2].layout = this_00;
    }
  }
  return this_00;
}

Assistant:

QTextLayout *QTextBlock::layout() const
{
    if (!p || !n)
        return nullptr;

    const QTextBlockData *b = p->blockMap().fragment(n);
    if (!b->layout)
        b->layout = new QTextLayout(*this);
    return b->layout;
}